

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O3

bool __thiscall
QAbstractProxyModel::dropMimeData
          (QAbstractProxyModel *this,QMimeData *data,DropAction action,int row,int column,
          QModelIndex *parent)

{
  QAbstractProxyModelPrivate *this_00;
  QAbstractItemModel *pQVar1;
  int iVar2;
  long in_FS_OFFSET;
  int sourceDestinationColumn;
  int sourceDestinationRow;
  QModelIndex local_58;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractProxyModelPrivate **)(this + 8);
  local_3c = 0xaaaaaaaa;
  local_40 = 0xaaaaaaaa;
  local_58.r = -1;
  local_58.c = -1;
  local_58.i = 0;
  local_58.m.ptr = (QAbstractItemModel *)0x0;
  QAbstractProxyModelPrivate::mapDropCoordinatesToSource
            (this_00,row,column,parent,(int *)&local_3c,(int *)&local_40,&local_58);
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  ::value(&this_00->model);
  pQVar1 = (this_00->model).super_QPropertyData<QAbstractItemModel_*>.val;
  iVar2 = (*(pQVar1->super_QObject)._vptr_QObject[0x1c])
                    (pQVar1,data,(ulong)action,(ulong)local_3c,(ulong)local_40,&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SUB41(iVar2,0);
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractProxyModel::dropMimeData(const QMimeData *data, Qt::DropAction action,
                                       int row, int column, const QModelIndex &parent)
{
    Q_D(QAbstractProxyModel);
    int sourceDestinationRow;
    int sourceDestinationColumn;
    QModelIndex sourceParent;
    d->mapDropCoordinatesToSource(row, column, parent, &sourceDestinationRow, &sourceDestinationColumn, &sourceParent);
    return d->model->dropMimeData(data, action, sourceDestinationRow, sourceDestinationColumn, sourceParent);
}